

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieNew.c
# Opt level: O0

void Au_NtkCleanCopy(Au_Ntk_t *p)

{
  int nSize;
  Au_Ntk_t *p_local;
  
  nSize = Au_NtkObjNumMax(p);
  Vec_IntFill(&p->vCopies,nSize,-1);
  return;
}

Assistant:

void Au_NtkCleanCopy( Au_Ntk_t * p )
{
    Vec_IntFill( &p->vCopies, Au_NtkObjNumMax(p), -1 );
}